

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::WriteTextureColorEntry
          (ColladaExporter *this,Surface *pSurface,string *pTypeName,string *pImageName)

{
  ostream *poVar1;
  ulong uVar2;
  string local_48;
  string *local_28;
  string *pImageName_local;
  string *pTypeName_local;
  Surface *pSurface_local;
  ColladaExporter *this_local;
  
  if ((pSurface->exist & 1U) != 0) {
    local_28 = pImageName;
    pImageName_local = pTypeName;
    pTypeName_local = (string *)pSurface;
    pSurface_local = (Surface *)this;
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<");
    poVar1 = std::operator<<(poVar1,(string *)pImageName_local);
    poVar1 = std::operator<<(poVar1,">");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar1 = std::operator<<(poVar1,"<texture texture=\"");
      XMLEscape(&local_48,local_28);
      poVar1 = std::operator<<(poVar1,(string *)&local_48);
      poVar1 = std::operator<<(poVar1,"\" texcoord=\"CHANNEL");
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,*(ulong *)((long)&pTypeName_local[1].field_2 + 8));
      poVar1 = std::operator<<(poVar1,"\" />");
      std::operator<<(poVar1,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar1 = std::operator<<(poVar1,"<color sid=\"");
      poVar1 = std::operator<<(poVar1,(string *)pImageName_local);
      poVar1 = std::operator<<(poVar1,"\">");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)&pTypeName_local->field_0x4);
      poVar1 = std::operator<<(poVar1,"   ");
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,*(float *)&pTypeName_local->_M_string_length);
      poVar1 = std::operator<<(poVar1,"   ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,*(float *)((long)&pTypeName_local->_M_string_length + 4));
      poVar1 = std::operator<<(poVar1,"   ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)&pTypeName_local->field_2);
      poVar1 = std::operator<<(poVar1,"</color>");
      std::operator<<(poVar1,(string *)&this->endstr);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</");
    poVar1 = std::operator<<(poVar1,(string *)pImageName_local);
    poVar1 = std::operator<<(poVar1,">");
    std::operator<<(poVar1,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextureColorEntry( const Surface& pSurface, const std::string& pTypeName, const std::string& pImageName)
{
  if(pSurface.exist) {
    mOutput << startstr << "<" << pTypeName << ">" << endstr;
    PushTag();
    if( pSurface.texture.empty() )
    {
      mOutput << startstr << "<color sid=\"" << pTypeName << "\">" << pSurface.color.r << "   " << pSurface.color.g << "   " << pSurface.color.b << "   " << pSurface.color.a << "</color>" << endstr;
    }
    else
    {
      mOutput << startstr << "<texture texture=\"" << XMLEscape(pImageName) << "\" texcoord=\"CHANNEL" << pSurface.channel << "\" />" << endstr;
    }
    PopTag();
    mOutput << startstr << "</" << pTypeName << ">" << endstr;
  }
}